

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::Buffers::DataTest::LogFail
          (DataTest *this,offset_in_DataTest_to_subr UploadDataFunction,GLenum parameter,
          GLuint *data,GLuint *reference,GLsizei count)

{
  ostringstream *this_00;
  undefined4 in_register_00000014;
  undefined4 in_register_0000008c;
  ulong uVar1;
  string the_log;
  stringstream bitfield_string_stream;
  long *local_228;
  long local_220;
  long local_218 [2];
  Bitfield<16UL> local_208;
  DataTest *local_1e8;
  undefined8 local_1e0;
  GLuint *local_1d8;
  Bitfield<16UL> local_1d0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e0 = CONCAT44(in_register_0000008c,count);
  local_228 = local_218;
  local_1e8 = this;
  local_1d8 = reference;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"The test of ","");
  std::__cxx11::string::append((char *)&local_228);
  if ((code *)UploadDataFunction == UploadUsingNamedBufferStorage &&
      CONCAT44(in_register_00000014,parameter) == 0) {
    std::__cxx11::string::append((char *)&local_228);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    glu::getBufferMapFlagsStr(&local_1d0,(int)data);
    local_208.m_end = local_1d0.m_end;
    local_208.m_value = local_1d0.m_value;
    local_208.m_begin = local_1d0.m_begin;
    tcu::Format::Bitfield<16UL>::toStream(&local_208,(ostream *)local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append((char *)&local_228,local_208.m_value);
    if ((BitDesc **)local_208.m_value != &local_208.m_end) {
      operator_delete((void *)local_208.m_value,(ulong)((long)&(local_208.m_end)->bit + 1));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    std::__cxx11::string::append((char *)&local_228);
    glu::getUsageName((int)data);
    std::__cxx11::string::append((char *)&local_228);
  }
  std::__cxx11::string::append((char *)&local_228);
  if (0 < (int)(uint)the_log._M_string_length) {
    uVar1 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)&local_228,local_208.m_value);
      if ((BitDesc **)local_208.m_value != &local_208.m_end) {
        operator_delete((void *)local_208.m_value,(ulong)((long)&(local_208.m_end)->bit + 1));
      }
      if ((uint)the_log._M_string_length - 1 != uVar1) {
        std::__cxx11::string::append((char *)&local_228);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar1 = uVar1 + 1;
    } while ((uint)the_log._M_string_length != uVar1);
  }
  std::__cxx11::string::append((char *)&local_228);
  if (0 < (int)(uint)the_log._M_string_length) {
    uVar1 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)&local_228,local_208.m_value);
      if ((BitDesc **)local_208.m_value != &local_208.m_end) {
        operator_delete((void *)local_208.m_value,(ulong)((long)&(local_208.m_end)->bit + 1));
      }
      if ((uint)the_log._M_string_length - 1 != uVar1) {
        std::__cxx11::string::append((char *)&local_228);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar1 = uVar1 + 1;
    } while ((uint)the_log._M_string_length != uVar1);
  }
  std::__cxx11::string::append((char *)&local_228);
  local_1b8._0_8_ = ((local_1e8->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)local_228,local_220)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x68));
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  return;
}

Assistant:

void DataTest::LogFail(void (DataTest::*UploadDataFunction)(glw::GLuint, glw::GLenum), glw::GLenum parameter,
					   const glw::GLuint* data, const glw::GLuint* reference, const glw::GLsizei count)
{
	std::string the_log = "The test of ";

	if (UploadDataFunction == &DataTest::UploadUsingNamedBufferData)
	{
		the_log.append("glNamedBufferData");
	}
	else
	{
		if (UploadDataFunction == &DataTest::UploadUsingNamedBufferSubData)
		{
			the_log.append("glNamedBufferSubData");
		}
		else
		{
			if (UploadDataFunction == &DataTest::UploadUsingNamedBufferStorage)
			{
				the_log.append("glNamedBufferStorage");
			}
			else
			{
				if (UploadDataFunction == &DataTest::UploadUsingCopyNamedBufferSubData)
				{
					the_log.append("glCopyNamedBufferSubData");
				}
				else
				{
					the_log.append("uknown upload function");
				}
			}
		}
	}

	if (UploadDataFunction == &DataTest::UploadUsingNamedBufferStorage)
	{
		the_log.append(" called with usage parameter ");

		std::stringstream bitfield_string_stream;
		bitfield_string_stream << glu::getBufferMapFlagsStr(parameter);
		the_log.append(bitfield_string_stream.str());
	}
	else
	{
		the_log.append(" called with usage parameter ");
		the_log.append(glu::getUsageName(parameter));
	}
	the_log.append(". Buffer data is equal to [");

	for (glw::GLsizei i = 0; i < count; ++i)
	{
		std::stringstream number;

		number << data[i];

		the_log.append(number.str());

		if (i != count - 1)
		{
			the_log.append(", ");
		}
	}

	the_log.append("], but [");

	for (glw::GLsizei i = 0; i < count; ++i)
	{
		std::stringstream number;

		number << reference[i];

		the_log.append(number.str());

		if (i != count - 1)
		{
			the_log.append(", ");
		}
	}

	the_log.append("] was expected.");

	m_context.getTestContext().getLog() << tcu::TestLog::Message << the_log << tcu::TestLog::EndMessage;
}